

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String __thiscall doctest::detail::fpToString<double>(detail *this,double value,int precision)

{
  long lVar1;
  string d;
  string local_1b0 [32];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  *(long *)(&oss.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
           (long)oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) =
       (long)precision;
  *(uint *)(&oss.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18 +
           (long)oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) =
       *(uint *)(&oss.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18 +
                (long)oss.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]
                ) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(value);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)&d,0x30);
  if ((lVar1 != -1) && (lVar1 != d._M_string_length - 1)) {
    std::__cxx11::string::substr((ulong)local_1b0,(ulong)&d);
    std::__cxx11::string::operator=((string *)&d,local_1b0);
    std::__cxx11::string::~string(local_1b0);
  }
  String::String((String *)this,d._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&d);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return (String)(char *)this;
}

Assistant:

String fpToString(T value, int precision) {
        std::ostringstream oss;
        oss << std::setprecision(precision) << std::fixed << value;
        std::string d = oss.str();
        size_t      i = d.find_last_not_of('0');
        if(i != std::string::npos && i != d.size() - 1) {
            if(d[i] == '.')
                i++;
            d = d.substr(0, i + 1);
        }
        return d.c_str();
    }